

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

ArrayBuilder<kj::Maybe<kj::Own<capnp::ClientHook>_>_> * __thiscall
kj::ArrayBuilder<kj::Maybe<kj::Own<capnp::ClientHook>_>_>::operator=
          (ArrayBuilder<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *this,
          ArrayBuilder<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *other)

{
  RemoveConst<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *pRVar1;
  ArrayDisposer *pAVar2;
  
  dispose(this);
  pRVar1 = other->pos;
  this->ptr = other->ptr;
  this->pos = pRVar1;
  pAVar2 = other->disposer;
  this->endPtr = other->endPtr;
  this->disposer = pAVar2;
  other->ptr = (Maybe<kj::Own<capnp::ClientHook>_> *)0x0;
  other->pos = (RemoveConst<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *)0x0;
  other->endPtr = (Maybe<kj::Own<capnp::ClientHook>_> *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }